

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  _HashNode *p_Var5;
  SQTable *pSVar6;
  undefined4 uVar7;
  SQObjectFlags SVar8;
  undefined3 uVar9;
  SQFloat SVar10;
  ulong uVar11;
  _HashNode *p_Var12;
  _HashNode *p_Var13;
  uint64_t uVar14;
  ulong uVar15;
  _HashNode *p_Var16;
  
LAB_001400b4:
  SVar3 = (key->super_SQObject)._type;
  if ((int)SVar3 < 0x5000004) {
    if ((SVar3 == OT_BOOL) || (SVar3 == OT_INTEGER)) {
      SVar10 = (key->super_SQObject)._unVal.fFloat;
    }
    else {
LAB_001400ef:
      SVar10 = (SQFloat)((key->super_SQObject)._unVal.nInteger >> 4);
    }
  }
  else if (SVar3 == OT_FLOAT) {
    SVar10 = (SQFloat)(long)(key->super_SQObject)._unVal.fFloat;
  }
  else {
    if (SVar3 != OT_STRING) goto LAB_001400ef;
    SVar10 = (SQFloat)((key->super_SQObject)._unVal.pString)->_hash;
  }
  uVar11 = (ulong)((uint)SVar10 & this->_numofnodes_minus_one);
  p_Var16 = this->_nodes + uVar11;
  p_Var13 = p_Var16;
  do {
    if (((p_Var13->key).super_SQObject._unVal.pTable == (key->super_SQObject)._unVal.pTable) &&
       ((p_Var13->key).super_SQObject._type == SVar3)) goto LAB_0014012d;
    p_Var13 = p_Var13->next;
  } while (p_Var13 != (_HashNode *)0x0);
  p_Var13 = (_HashNode *)0x0;
LAB_0014012d:
  if (p_Var13 != (_HashNode *)0x0) {
    SVar3 = (p_Var13->val).super_SQObject._type;
    pSVar6 = (p_Var13->val).super_SQObject._unVal.pTable;
    SVar8 = (val->super_SQObject)._flags;
    uVar9 = *(undefined3 *)&(val->super_SQObject).field_0x5;
    SVar10 = (val->super_SQObject)._unVal.fFloat;
    uVar7 = *(undefined4 *)((long)&(val->super_SQObject)._unVal + 4);
    (p_Var13->val).super_SQObject._type = (val->super_SQObject)._type;
    (p_Var13->val).super_SQObject._flags = SVar8;
    *(undefined3 *)&(p_Var13->val).super_SQObject.field_0x5 = uVar9;
    (p_Var13->val).super_SQObject._unVal.fFloat = SVar10;
    *(undefined4 *)((long)&(p_Var13->val).super_SQObject._unVal + 4) = uVar7;
    if (((p_Var13->val).super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &(((p_Var13->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    return false;
  }
  SVar4 = (p_Var16->key).super_SQObject._type;
  if (SVar4 == OT_NULL) goto LAB_001402a8;
  if ((int)SVar4 < 0x5000004) {
    if ((SVar4 == OT_BOOL) || (SVar4 == OT_INTEGER)) {
      SVar10 = (p_Var16->key).super_SQObject._unVal.fFloat;
    }
    else {
LAB_00140181:
      SVar10 = (SQFloat)((p_Var16->key).super_SQObject._unVal.nInteger >> 4);
    }
  }
  else if (SVar4 == OT_FLOAT) {
    SVar10 = (SQFloat)(long)(p_Var16->key).super_SQObject._unVal.fFloat;
  }
  else {
    if (SVar4 != OT_STRING) goto LAB_00140181;
    SVar10 = (SQFloat)((p_Var16->key).super_SQObject._unVal.pString)->_hash;
  }
  p_Var13 = this->_firstfree;
  if ((p_Var13 < p_Var16) &&
     (uVar15 = (ulong)((uint)SVar10 & this->_numofnodes_minus_one), uVar15 != uVar11)) {
    pSVar2 = &p_Var16->key;
    p_Var5 = this->_nodes + uVar15;
    do {
      p_Var12 = p_Var5;
      p_Var5 = p_Var12->next;
    } while (p_Var5 != p_Var16);
    p_Var12->next = p_Var13;
    SVar4 = (p_Var13->key).super_SQObject._type;
    pSVar6 = (p_Var13->key).super_SQObject._unVal.pTable;
    SVar8 = (p_Var16->key).super_SQObject._flags;
    uVar9 = *(undefined3 *)&(p_Var16->key).super_SQObject.field_0x5;
    SVar10 = (p_Var16->key).super_SQObject._unVal.fFloat;
    uVar7 = *(undefined4 *)((long)&(p_Var16->key).super_SQObject._unVal + 4);
    (p_Var13->key).super_SQObject._type = (pSVar2->super_SQObject)._type;
    (p_Var13->key).super_SQObject._flags = SVar8;
    *(undefined3 *)&(p_Var13->key).super_SQObject.field_0x5 = uVar9;
    (p_Var13->key).super_SQObject._unVal.fFloat = SVar10;
    *(undefined4 *)((long)&(p_Var13->key).super_SQObject._unVal + 4) = uVar7;
    if (((p_Var13->key).super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &(((p_Var13->key).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SVar4 = (p_Var13->val).super_SQObject._type;
    pSVar6 = (p_Var13->val).super_SQObject._unVal.pTable;
    SVar8 = (p_Var16->val).super_SQObject._flags;
    uVar9 = *(undefined3 *)&(p_Var16->val).super_SQObject.field_0x5;
    SVar10 = (p_Var16->val).super_SQObject._unVal.fFloat;
    uVar7 = *(undefined4 *)((long)&(p_Var16->val).super_SQObject._unVal + 4);
    (p_Var13->val).super_SQObject._type = (p_Var16->val).super_SQObject._type;
    (p_Var13->val).super_SQObject._flags = SVar8;
    *(undefined3 *)&(p_Var13->val).super_SQObject.field_0x5 = uVar9;
    (p_Var13->val).super_SQObject._unVal.fFloat = SVar10;
    *(undefined4 *)((long)&(p_Var13->val).super_SQObject._unVal + 4) = uVar7;
    if (((p_Var13->val).super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &(((p_Var13->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    p_Var13->next = p_Var16->next;
    pSVar6 = (p_Var16->key).super_SQObject._unVal.pTable;
    SVar4 = (p_Var16->key).super_SQObject._type;
    (pSVar2->super_SQObject)._type = 0;
    (pSVar2->super_SQObject)._flags = '\0';
    *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = 0;
    (p_Var16->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
    (p_Var16->key).super_SQObject._type = OT_NULL;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar6 = (p_Var16->val).super_SQObject._unVal.pTable;
    SVar4 = (p_Var16->val).super_SQObject._type;
    (p_Var16->val).super_SQObject._type = 0;
    (p_Var16->val).super_SQObject._flags = '\0';
    *(undefined3 *)&(p_Var16->val).super_SQObject.field_0x5 = 0;
    (p_Var16->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
    (p_Var16->val).super_SQObject._type = OT_NULL;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    p_Var16->next = (_HashNode *)0x0;
  }
  else {
    p_Var13->next = p_Var16->next;
    p_Var16->next = p_Var13;
    p_Var16 = p_Var13;
  }
LAB_001402a8:
  SVar4 = (p_Var16->key).super_SQObject._type;
  pSVar6 = (p_Var16->key).super_SQObject._unVal.pTable;
  SVar8 = (key->super_SQObject)._flags;
  uVar9 = *(undefined3 *)&(key->super_SQObject).field_0x5;
  SVar10 = (key->super_SQObject)._unVal.fFloat;
  uVar7 = *(undefined4 *)((long)&(key->super_SQObject)._unVal + 4);
  (p_Var16->key).super_SQObject._type = (key->super_SQObject)._type;
  (p_Var16->key).super_SQObject._flags = SVar8;
  *(undefined3 *)&(p_Var16->key).super_SQObject.field_0x5 = uVar9;
  (p_Var16->key).super_SQObject._unVal.fFloat = SVar10;
  *(undefined4 *)((long)&(p_Var16->key).super_SQObject._unVal + 4) = uVar7;
  if (((p_Var16->key).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((p_Var16->key).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar4 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  p_Var13 = this->_firstfree;
  do {
    if (((p_Var13->key).super_SQObject._type == OT_NULL) && (p_Var13->next == (_HashNode *)0x0)) {
      SVar4 = (p_Var16->val).super_SQObject._type;
      pSVar6 = (p_Var16->val).super_SQObject._unVal.pTable;
      SVar8 = (val->super_SQObject)._flags;
      uVar9 = *(undefined3 *)&(val->super_SQObject).field_0x5;
      SVar10 = (val->super_SQObject)._unVal.fFloat;
      uVar7 = *(undefined4 *)((long)&(val->super_SQObject)._unVal + 4);
      (p_Var16->val).super_SQObject._type = (val->super_SQObject)._type;
      (p_Var16->val).super_SQObject._flags = SVar8;
      *(undefined3 *)&(p_Var16->val).super_SQObject.field_0x5 = uVar9;
      (p_Var16->val).super_SQObject._unVal.fFloat = SVar10;
      *(undefined4 *)((long)&(p_Var16->val).super_SQObject._unVal + 4) = uVar7;
      if (((p_Var16->val).super_SQObject._type & 0x8000000) != 0) {
        pSVar1 = &(((p_Var16->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      uVar14 = 0;
      if ((SVar3 == OT_STRING) && (this->_numofnodes_minus_one < 0x20)) {
        uVar11 = this->_classTypeId;
        if ((uVar11 == 0) && (this->_usednodes != 0)) goto LAB_001403fb;
        uVar15 = 0xcbf29ce484222325;
        if (uVar11 != 0) {
          uVar15 = uVar11;
        }
        uVar15 = (((uint)((int)p_Var16 - *(int *)&this->_nodes) >> 3) * -0x33333333 & 0xff ^ uVar15)
                 * 0x100000001b3;
        this->_classTypeId = uVar15;
        uVar11 = (key->super_SQObject)._unVal.nInteger;
        uVar14 = (((ulong)((uint)(uVar11 >> 0x13) & 0xff) ^
                  ((ulong)((uint)(uVar11 >> 0xb) & 0xff) ^
                  ((uint)(uVar11 >> 3) & 0xff ^ uVar15) * 0x100000001b3) * 0x100000001b3) *
                  0x100000001b3 ^ uVar11 >> 0x1b & 0xff) * 0x100000001b3;
      }
      this->_classTypeId = uVar14;
LAB_001403fb:
      this->_usednodes = this->_usednodes + 1;
      return true;
    }
    if (p_Var13 == this->_nodes) break;
    p_Var13 = p_Var13 + -1;
    this->_firstfree = p_Var13;
  } while( true );
  Rehash(this,true);
  goto LAB_001400b4;
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &__restrict key,const SQObjectPtr &__restrict val  VT_DECL_ARG)
{
    assert(sq_type(key) != OT_NULL);
    SQHash h = HashObj(key) & _numofnodes_minus_one;
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        VT_CODE(if (var_trace_arg) n->varTrace = *var_trace_arg);
        VT_TRACE_SINGLE(n, val, _ss(this)->_root_vm);
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;

    //key not found I'll insert it
    //main pos is not free

    if(sq_type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & _numofnodes_minus_one;
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            VT_COPY_SINGLE(mp, n);
            mp->key.Null();
            mp->val.Null();
            VT_CLEAR_SINGLE(mp);
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (sq_type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            VT_CODE(if (var_trace_arg) mp->varTrace = *var_trace_arg);
            VT_TRACE_SINGLE(mp, val, _ss(this)->_root_vm);

            // update class type id
            if (sq_isstring(key) && (_numofnodes_minus_one < (1<<TBL_CLASS_TYPE_MEMBER_BITS))) {
                if (_classTypeId != 0 || _usednodes==0) {
                    uint8_t insertPos = mp - _nodes;
                    _classTypeId = class_type_hash_update_1(_classTypeId ? _classTypeId : CLASS_TYPE_HASH_INIT, insertPos);

                    // Use SQString address as identifier, strings are unique, immutable and strored in a table.
                    // That means that all script strings share the same reference to SQString.
                    // 32 provides more than realistic address range.
                    uint32_t strIdBits = uint32_t( (uintptr_t(_string(key)) >> 3) & 0xFFFFFFFF );
                    _classTypeId = class_type_hash_update_4(_classTypeId, strIdBits);
                }
            } else {
                _classTypeId = 0;
            }

            ++_usednodes;

            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val  VT_CODE(VT_COMMA var_trace_arg));
}